

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void dfg_shutdown_handler
               (CManager_conflict cm,CMConnection conn,void *vmsg,void *client_data,attr_list attrs)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long in_RCX;
  undefined4 *in_RDX;
  long in_RDI;
  timespec ts_1;
  timespec ts;
  int i;
  EVshutdown_ptr msg;
  EVclient client;
  uint in_stack_ffffffffffffff8c;
  uint uVar4;
  CManager in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  long local_58;
  __time_t local_50;
  undefined4 local_48;
  CMTraceType in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  
  iVar5 = 0;
  IntCManager_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  *(undefined4 *)(in_RCX + 0x18) = *in_RDX;
  *(undefined4 *)(in_RCX + 0x40) = 1;
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init((CManager)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff90 = *(CManager *)(in_RDI + 0x120);
      _Var2 = getpid();
      in_stack_ffffffffffffff98 = (char *)(long)_Var2;
      pVar3 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffff90,"P%lxT%lx - ",in_stack_ffffffffffffff98,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_50);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_50,
              CONCAT44(in_stack_ffffffffffffffbc,local_48));
    }
    fprintf(*(FILE **)(in_RDI + 0x120),"Client %d has confirmed shutdown\n",
            (ulong)*(uint *)(in_RCX + 0x30));
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  while( true ) {
    uVar4 = in_stack_ffffffffffffff8c & 0xffffff;
    if (*(long *)(in_RCX + 8) != 0) {
      uVar4 = CONCAT13(*(int *)(*(long *)(in_RCX + 8) + (long)iVar5 * 4) != -1,
                       (int3)in_stack_ffffffffffffff8c);
    }
    if ((char)(uVar4 >> 0x18) == '\0') break;
    in_stack_ffffffffffffff8c = uVar4;
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar1 = CMtrace_init((CManager)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffff8c = uVar4;
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = *(FILE **)(in_RDI + 0x120);
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffffa0);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffa0,local_58);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"Client %d shutdown signalling %d\n",
              (ulong)*(uint *)(in_RCX + 0x30),
              (ulong)*(uint *)(*(long *)(in_RCX + 8) + (long)iVar5 * 4));
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    iVar5 = iVar5 + 1;
    INT_CMCondition_signal(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  }
  IntCManager_unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  return;
}

Assistant:

static void
dfg_shutdown_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = client_data;
    EVshutdown_ptr msg =  vmsg;
    (void)cm;
    (void)conn;
    (void)attrs;
    int i = 0;
    CManager_lock(cm);
    /* I'm the client, all is done */
    client->shutdown_value = msg->value;
    client->already_shutdown = 1;
    CMtrace_out(cm, EVdfgVerbose, "Client %d has confirmed shutdown\n", client->my_node_id);
    while (client->shutdown_conditions && (client->shutdown_conditions[i] != -1)){
	CMtrace_out(cm, EVdfgVerbose, "Client %d shutdown signalling %d\n", client->my_node_id, client->shutdown_conditions[i]);
	INT_CMCondition_signal(client->cm, client->shutdown_conditions[i++]);
    }
//GSE  - does client have state?
//    CMtrace_out(cm, EVdfgVerbose, "EVDFG exit shutdown master DFG state is %s\n", str_state[client->state]);
    CManager_unlock(cm);
}